

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall TcpServerImpl::Close(TcpServerImpl *this)

{
  _Manager_type p_Var1;
  
  p_Var1 = (this->m_fNewConnection).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_fNewConnection,(_Any_data *)&this->m_fNewConnection,
              __destroy_functor);
    (this->m_fNewConnection).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->m_fNewConnection)._M_invoker = (_Invoker_type)0x0;
  }
  (this->super_BaseSocketImpl).m_bStop = true;
  return;
}

Assistant:

void TcpServerImpl::Close() noexcept
{
    m_fNewConnection = nullptr;
    m_bStop = true; // Stops the listening thread, deletes all Sockets at the end of the listening thread
}